

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

bool __thiscall Reducer::writeAndTestReduction(Reducer *this,ProgramResult *out)

{
  undefined8 this_00;
  bool bVar1;
  Module *pMVar2;
  string local_e0;
  string local_c0 [48];
  undefined1 local_90 [8];
  ModuleWriter writer;
  ProgramResult *out_local;
  Reducer *this_local;
  
  writer.sourceMapUrl.field_2._8_8_ = out;
  wasm::ModuleWriter::ModuleWriter((ModuleWriter *)local_90,&this->toolOptions->passOptions);
  wasm::ModuleWriter::setBinary((ModuleWriter *)local_90,(bool)(this->binary & 1));
  wasm::ModuleIOBase::setDebugInfo((ModuleIOBase *)local_90,(bool)(this->debugInfo & 1));
  pMVar2 = wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                       ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                       super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>);
  std::__cxx11::string::string(local_c0,(string *)&this->test);
  wasm::ModuleWriter::write(local_90,pMVar2,local_c0);
  std::__cxx11::string::~string(local_c0);
  this_00 = writer.sourceMapUrl.field_2._8_8_;
  std::__cxx11::string::string((string *)&local_e0,(string *)&this->command);
  ProgramResult::getFromExecution((ProgramResult *)this_00,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  bVar1 = ProgramResult::operator==((ProgramResult *)writer.sourceMapUrl.field_2._8_8_,&expected);
  wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)local_90);
  return bVar1;
}

Assistant:

bool writeAndTestReduction(ProgramResult& out) {
    // write the module out
    ModuleWriter writer(toolOptions.passOptions);
    writer.setBinary(binary);
    writer.setDebugInfo(debugInfo);
    writer.write(*getModule(), test);
    // note that it is ok for the destructively-reduced module to be bigger
    // than the previous - each destructive reduction removes logical code,
    // and so is strictly better, even if the wasm binary format happens to
    // encode things slightly less efficiently.
    // test it
    out.getFromExecution(command);
    return out == expected;
  }